

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O0

void ZSTD_fillDoubleHashTable
               (ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm,
               ZSTD_tableFillPurpose_e tfp)

{
  ZSTD_tableFillPurpose_e tfp_local;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  void *end_local;
  ZSTD_matchState_t *ms_local;
  
  if (tfp == ZSTD_tfp_forCDict) {
    ZSTD_fillDoubleHashTableForCDict(ms,end,dtlm);
  }
  else {
    ZSTD_fillDoubleHashTableForCCtx(ms,end,dtlm);
  }
  return;
}

Assistant:

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm,
                        ZSTD_tableFillPurpose_e tfp)
{
    if (tfp == ZSTD_tfp_forCDict) {
        ZSTD_fillDoubleHashTableForCDict(ms, end, dtlm);
    } else {
        ZSTD_fillDoubleHashTableForCCtx(ms, end, dtlm);
    }
}